

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O0

void __thiscall
CCollision::MoveBox(CCollision *this,vec2 *pInoutPos,vec2 *pInoutVel,vec2 Size,float Elasticity,
                   bool *pDeath)

{
  vec2 Pos_00;
  vec2 Pos_01;
  vec2 Pos_02;
  vec2 Pos_03;
  vec2 Size_00;
  vec2 Size_01;
  vec2 Size_02;
  vec2 Size_03;
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  vector2_base<float> *in_RSI;
  long in_FS_OFFSET;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar4;
  float fVar5;
  undefined8 in_XMM0_Qa;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_XMM1_Da;
  int Hits;
  int i;
  float Fraction;
  int Max;
  float Distance;
  vec2 NewPos;
  vec2 Vel;
  vec2 Pos;
  vector2_base<float> in_stack_ffffffffffffff58;
  int iVar6;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar7;
  undefined4 uStack_8c;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_ffffffffffffff78;
  vector2_base<float> local_60;
  undefined8 local_58;
  vector2_base<float> local_50;
  undefined8 local_48;
  vector2_base<float> local_40;
  vector2_base<float> local_38;
  vector2_base<float> local_30;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_28;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_24;
  undefined8 local_20;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_18;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_14;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  aVar7 = SUB84(in_RCX,0);
  uStack_8c = (undefined4)((ulong)in_RCX >> 0x20);
  _local_18 = *in_RSI;
  local_20 = *in_RDX;
  local_10 = in_XMM0_Qa;
  aVar4.x = length((vector2_base<float> *)0x25a475);
  iVar3 = (int)aVar4.x;
  if (CONCAT44(uStack_8c,aVar7) != 0) {
    *(undefined1 *)CONCAT44(uStack_8c,aVar7) = 0;
  }
  if (1e-05 < aVar4.x) {
    fVar5 = 1.0 / (float)(iVar3 + 1);
    for (iVar6 = 0; iVar6 <= iVar3; iVar6 = iVar6 + 1) {
      local_30 = vector2_base<float>::operator*
                           ((vector2_base<float> *)CONCAT44(fVar5,iVar6),
                            in_stack_ffffffffffffff58.field_1.y);
      _local_28 = vector2_base<float>::operator+
                            ((vector2_base<float> *)CONCAT44(fVar5,iVar6),
                             (vector2_base<float> *)in_stack_ffffffffffffff58);
      if (CONCAT44(uStack_8c,aVar7) != 0) {
        vector2_base<float>::vector2_base(&local_38,local_28.x,aStack_24.y);
        in_stack_ffffffffffffff58 =
             vector2_base<float>::operator*
                       ((vector2_base<float> *)CONCAT44(fVar5,iVar6),
                        in_stack_ffffffffffffff58.field_1.y);
        Pos_00.field_1 = aVar7;
        Pos_00.field_0 = aVar4;
        Size_00.field_1 = in_XMM1_Da;
        Size_00.field_0 = in_stack_ffffffffffffff78;
        bVar1 = TestBox((CCollision *)CONCAT44(fVar5,iVar6),Pos_00,Size_00,
                        (int)in_stack_ffffffffffffff58.field_1);
        if (bVar1) {
          *(undefined1 *)CONCAT44(uStack_8c,aVar7) = 1;
        }
      }
      vector2_base<float>::vector2_base(&local_40,local_28.x,aStack_24.y);
      local_48 = local_10;
      Pos_01.field_1 = aVar7;
      Pos_01.field_0 = aVar4;
      Size_01.field_1.y = in_XMM1_Da.y;
      Size_01.field_0 = in_stack_ffffffffffffff78;
      bVar1 = TestBox((CCollision *)CONCAT44(fVar5,iVar6),Pos_01,Size_01,
                      (int)in_stack_ffffffffffffff58.field_1);
      if (bVar1) {
        vector2_base<float>::vector2_base(&local_50,local_18.x,aStack_24.y);
        local_58 = local_10;
        Pos_02.field_1 = aVar7;
        Pos_02.field_0 = aVar4;
        Size_02.field_1.y = in_XMM1_Da.y;
        Size_02.field_0 = in_stack_ffffffffffffff78;
        cVar2 = TestBox((CCollision *)CONCAT44(fVar5,iVar6),Pos_02,Size_02,
                        (int)in_stack_ffffffffffffff58.field_1);
        if ((bool)cVar2) {
          aStack_24.y = aStack_14.y;
          local_20 = CONCAT44(-in_XMM1_Da.y * local_20._4_4_,(float)local_20);
        }
        vector2_base<float>::vector2_base(&local_60,local_28.x,aStack_14.y);
        Pos_03.field_1 = aVar7;
        Pos_03.field_0 = aVar4;
        Size_03.field_1.y = in_XMM1_Da.y;
        Size_03.field_0 = in_stack_ffffffffffffff78;
        bVar1 = TestBox((CCollision *)CONCAT44(fVar5,iVar6),Pos_03,Size_03,
                        (int)in_stack_ffffffffffffff58.field_1);
        if (bVar1) {
          local_28 = local_18;
          local_20 = CONCAT44(local_20._4_4_,-in_XMM1_Da.y * (float)local_20);
          cVar2 = cVar2 + '\x01';
        }
        if (cVar2 == '\0') {
          _local_28 = _local_18;
          local_20 = CONCAT44(-in_XMM1_Da.y * local_20._4_4_,-in_XMM1_Da.y * (float)local_20);
        }
      }
      _local_18 = _local_28;
    }
  }
  *in_RSI = _local_18;
  *in_RDX = local_20;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCollision::MoveBox(vec2 *pInoutPos, vec2 *pInoutVel, vec2 Size, float Elasticity, bool *pDeath) const
{
	// do the move
	vec2 Pos = *pInoutPos;
	vec2 Vel = *pInoutVel;

	const float Distance = length(Vel);
	const int Max = (int)Distance;

	if(pDeath)
		*pDeath = false;

	if(Distance > 0.00001f)
	{
		const float Fraction = 1.0f/(Max+1);
		for(int i = 0; i <= Max; i++)
		{
			vec2 NewPos = Pos + Vel*Fraction; // TODO: this row is not nice

			//You hit a deathtile, congrats to that :)
			//Deathtiles are a bit smaller
			if(pDeath && TestBox(vec2(NewPos.x, NewPos.y), Size*(2.0f/3.0f), COLFLAG_DEATH))
			{
				*pDeath = true;
			}

			if(TestBox(vec2(NewPos.x, NewPos.y), Size))
			{
				int Hits = 0;

				if(TestBox(vec2(Pos.x, NewPos.y), Size))
				{
					NewPos.y = Pos.y;
					Vel.y *= -Elasticity;
					Hits++;
				}

				if(TestBox(vec2(NewPos.x, Pos.y), Size))
				{
					NewPos.x = Pos.x;
					Vel.x *= -Elasticity;
					Hits++;
				}

				// neither of the tests got a collision.
				// this is a real _corner case_!
				if(Hits == 0)
				{
					NewPos.y = Pos.y;
					Vel.y *= -Elasticity;
					NewPos.x = Pos.x;
					Vel.x *= -Elasticity;
				}
			}

			Pos = NewPos;
		}
	}

	*pInoutPos = Pos;
	*pInoutVel = Vel;
}